

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

string * __thiscall
helics::FederateState::processQuery_abi_cxx11_
          (string *__return_storage_ptr__,FederateState *this,string_view query,bool force_ordering)

{
  __atomic_flag_data_type _Var1;
  int iVar2;
  string *psVar3;
  long *__s1;
  char *pcVar4;
  size_t __n;
  size_type __len1;
  undefined7 in_register_00000081;
  size_type __len2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  string_view fmt;
  format_args args;
  string sStack_58;
  pointer local_38;
  size_type sStack_30;
  
  __s1 = (long *)query._M_str;
  __n = query._M_len;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)CONCAT71(in_register_00000081,force_ordering) != 0) {
    if (__n == 5) goto switchD_002d6f13_caseD_5;
    if (__n == 0x11) goto switchD_002d6f13_caseD_11;
    if (__n == 7) goto switchD_002d6f13_caseD_7;
    goto switchD_002d6f13_caseD_8;
  }
  switch(__n) {
  case 5:
switchD_002d6f13_caseD_5:
    iVar2 = bcmp(__s1,"state",__n);
    if (iVar2 == 0) {
      psVar3 = fedStateString_abi_cxx11_((this->state)._M_i);
      local_38 = (psVar3->_M_dataplus)._M_p;
      sStack_30 = psVar3->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x4;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_38;
      ::fmt::v11::vformat_abi_cxx11_(&sStack_58,(v11 *)0x3ec30e,fmt,args);
      processQuery_abi_cxx11_();
      return __return_storage_ptr__;
    }
    break;
  case 6:
    pcVar4 = "inputs";
    goto LAB_002d6fdf;
  case 7:
switchD_002d6f13_caseD_7:
    pcVar4 = "queries";
    goto LAB_002d6f85;
  case 9:
    pcVar4 = "endpoints";
    goto LAB_002d6fdf;
  case 0xc:
    if ((int)__s1[1] == 0x736e6f69 && *__s1 == 0x746163696c627570) goto LAB_002d704f;
    pcVar4 = "global_state";
LAB_002d6fdf:
    iVar2 = bcmp(__s1,pcVar4,__n);
    if (iVar2 == 0) {
LAB_002d704f:
      processQueryActual_abi_cxx11_(&sStack_58,this,query);
      processQuery_abi_cxx11_();
      return __return_storage_ptr__;
    }
    break;
  case 0x11:
switchD_002d6f13_caseD_11:
    pcVar4 = "available_queries";
LAB_002d6f85:
    iVar2 = bcmp(__s1,pcVar4,__n);
    if (iVar2 == 0) {
      __len2 = 0xd1;
      pcVar4 = 
      "\"publications\",\"inputs\",\"logs\",\"endpoints\",\"subscriptions\",\"current_state\",\"global_state\",\"dependencies\",\"timeconfig\",\"config\",\"dependents\",\"current_time\",\"global_time\",\"global_status\",\"unconnected_interfaces\""
      ;
      __len1 = 0;
      goto LAB_002d700c;
    }
  }
switchD_002d6f13_caseD_8:
  LOCK();
  _Var1 = (this->processing).super___atomic_flag_base._M_i;
  (this->processing).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    processQueryActual_abi_cxx11_(&sStack_58,this,query);
    processQuery_abi_cxx11_();
    return __return_storage_ptr__;
  }
  __len1 = __return_storage_ptr__->_M_string_length;
  __len2 = 5;
  pcVar4 = "#wait";
LAB_002d700c:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,0,__len1,pcVar4,__len2);
  return __return_storage_ptr__;
}

Assistant:

std::string FederateState::processQuery(std::string_view query, bool force_ordering) const
{
    std::string qstring;
    if (!force_ordering &&
        (query == "publications" || query == "inputs" || query == "endpoints" ||
         query == "global_state")) {  // these never need to be locked
        qstring = processQueryActual(query);
    } else if ((query == "queries") || (query == "available_queries")) {
        qstring =
            R"("publications","inputs","logs","endpoints","subscriptions","current_state","global_state","dependencies","timeconfig","config","dependents","current_time","global_time","global_status","unconnected_interfaces")";
    } else if (query == "state") {
        qstring = fmt::format("\"{}\"", fedStateString(getState()));
    } else {  // the rest might need be locked to prevent a race condition
        if (try_lock()) {
            qstring = processQueryActual(query);
            unlock();
        } else {
            qstring = "#wait";
        }
    }
    return qstring;
}